

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * cmFileAPI::ComputeSuffixTime(string *__return_storage_ptr__,string *param_1)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  rep timeT;
  rep rVar3;
  ostream *poVar4;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream ss;
  cmTimestamp local_49;
  ulong uStack_48;
  cmTimestamp cmts;
  size_t tms;
  time_t ts;
  seconds s;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  milliseconds ms;
  string *param_0_local;
  
  ms.__r = (rep)param_1;
  s.__r = std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&s);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  ts = (time_t)std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000l>>
                         (&local_20);
  timeT = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)&ts);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
  uStack_48 = rVar3 % 1000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"%Y-%m-%dT%H-%M-%S",&local_209);
  cmTimestamp::CreateTimestampFromTimeT(&local_1e8,&local_49,timeT,&local_208,true);
  poVar4 = std::operator<<((ostream *)local_1c8,(string *)&local_1e8);
  poVar4 = std::operator<<(poVar4,'-');
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::ostream::operator<<(poVar4,uStack_48);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ComputeSuffixTime(std::string const&)
{
  std::chrono::milliseconds ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(
      std::chrono::system_clock::now().time_since_epoch());
  std::chrono::seconds s =
    std::chrono::duration_cast<std::chrono::seconds>(ms);

  std::time_t ts = s.count();
  std::size_t tms = ms.count() % 1000;

  cmTimestamp cmts;
  std::ostringstream ss;
  ss << cmts.CreateTimestampFromTimeT(ts, "%Y-%m-%dT%H-%M-%S", true) << '-'
     << std::setfill('0') << std::setw(4) << tms;
  return ss.str();
}